

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O3

void Abc_NtkPartitionPrint(Abc_Ntk_t *pNtk,Vec_Ptr_t *vPartsAll,Vec_Ptr_t *vPartSuppsAll)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  if (vPartSuppsAll->nSize < 1) {
    uVar3 = 0;
  }
  else {
    iVar2 = vPartsAll->nSize;
    uVar4 = 0;
    uVar3 = 0;
    do {
      if ((long)iVar2 <= (long)uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar1 = *(uint *)((long)vPartsAll->pArray[uVar4] + 4);
      printf("%d=(%d,%d) ",uVar4 & 0xffffffff,
             (ulong)*(uint *)((long)vPartSuppsAll->pArray[uVar4] + 4),(ulong)uVar1);
      uVar3 = uVar3 + uVar1;
      iVar2 = vPartsAll->nSize;
    } while ((uVar4 != iVar2 - 1) && (uVar4 = uVar4 + 1, (long)uVar4 < (long)vPartSuppsAll->nSize));
  }
  printf("\nTotal = %d. Outputs = %d.\n",(ulong)uVar3,(ulong)(uint)pNtk->vCos->nSize);
  return;
}

Assistant:

void Abc_NtkPartitionPrint( Abc_Ntk_t * pNtk, Vec_Ptr_t * vPartsAll, Vec_Ptr_t * vPartSuppsAll )
{
    Vec_Int_t * vOne;
    int i, nOutputs, Counter;

    Counter = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
    {
        nOutputs = Vec_IntSize((Vec_Int_t *)Vec_PtrEntry(vPartsAll, i));
        printf( "%d=(%d,%d) ", i, Vec_IntSize(vOne), nOutputs );
        Counter += nOutputs;
        if ( i == Vec_PtrSize(vPartsAll) - 1 )
            break;
    }
//    assert( Counter == Abc_NtkCoNum(pNtk) );
    printf( "\nTotal = %d. Outputs = %d.\n", Counter, Abc_NtkCoNum(pNtk) );
}